

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint *value;
  int model;
  UndoHistory history;
  Cmd cmd2;
  Cmd cmd1;
  bool local_79;
  uint local_78 [2];
  UndoHistory local_70;
  UndoCommand local_48;
  uint *local_40;
  undefined8 local_38;
  UndoCommand local_30;
  uint *local_28;
  undefined8 local_20;
  
  value = local_78 + 1;
  local_78[1] = 0;
  local_30._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00104d38;
  local_20 = 1;
  local_48._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00104d38;
  local_38 = 0x100000002;
  local_70._vptr_UndoHistory._0_4_ = 0;
  local_40 = value;
  local_28 = value;
  expect_eq<int,int>((int *)&local_70,(int *)value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x14);
  local_78[1] = 1;
  local_70._vptr_UndoHistory._0_4_ = 1;
  expect_eq<int,int>((int *)&local_70,(int *)value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x16);
  local_78[1] = 2;
  local_70._vptr_UndoHistory._0_4_ = 2;
  expect_eq<int,int>((int *)&local_70,(int *)value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x18);
  undo::UndoHistory::UndoHistory(&local_70,(UndoHistoryDelegate *)0x0);
  local_78[0] = local_78[0] & 0xffffff00;
  local_79 = undo::UndoHistory::canUndo(&local_70);
  expect_eq<bool,bool>
            ((bool *)local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x1b)
  ;
  local_78[0] = local_78[0] & 0xffffff00;
  local_79 = undo::UndoHistory::canRedo(&local_70);
  expect_eq<bool,bool>
            ((bool *)local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x1c)
  ;
  undo::UndoHistory::add(&local_70,&local_30);
  local_78[0]._0_1_ = true;
  local_79 = undo::UndoHistory::canUndo(&local_70);
  expect_eq<bool,bool>
            ((bool *)local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x1e)
  ;
  local_78[0]._0_1_ = false;
  local_79 = undo::UndoHistory::canRedo(&local_70);
  expect_eq<bool,bool>
            ((bool *)local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x1f)
  ;
  undo::UndoHistory::add(&local_70,&local_48);
  local_78[0]._0_1_ = true;
  local_79 = undo::UndoHistory::canUndo(&local_70);
  expect_eq<bool,bool>
            ((bool *)local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x21)
  ;
  local_78[0] = (uint)local_78[0]._1_3_ << 8;
  local_79 = undo::UndoHistory::canRedo(&local_70);
  expect_eq<bool,bool>
            ((bool *)local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x22)
  ;
  undo::UndoHistory::undo(&local_70);
  local_78[0] = 1;
  expect_eq<int,int>((int *)local_78,(int *)(local_78 + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x25);
  local_78[0]._0_1_ = true;
  local_79 = undo::UndoHistory::canUndo(&local_70);
  expect_eq<bool,bool>
            ((bool *)local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x26)
  ;
  local_78[0] = CONCAT31(local_78[0]._1_3_,1);
  local_79 = undo::UndoHistory::canRedo(&local_70);
  expect_eq<bool,bool>
            ((bool *)local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x27)
  ;
  undo::UndoHistory::undo(&local_70);
  local_78[0] = 0;
  expect_eq<int,int>((int *)local_78,(int *)(local_78 + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x29);
  local_78[0] = local_78[0] & 0xffffff00;
  local_79 = undo::UndoHistory::canUndo(&local_70);
  expect_eq<bool,bool>
            ((bool *)local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x2a)
  ;
  local_78[0] = CONCAT31(local_78[0]._1_3_,1);
  local_79 = undo::UndoHistory::canRedo(&local_70);
  expect_eq<bool,bool>
            ((bool *)local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x2b)
  ;
  undo::UndoHistory::redo(&local_70);
  local_78[0] = 1;
  expect_eq<int,int>((int *)local_78,(int *)(local_78 + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x2e);
  local_78[0]._0_1_ = true;
  local_79 = undo::UndoHistory::canUndo(&local_70);
  expect_eq<bool,bool>
            ((bool *)local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x2f)
  ;
  local_78[0] = CONCAT31(local_78[0]._1_3_,1);
  local_79 = undo::UndoHistory::canRedo(&local_70);
  expect_eq<bool,bool>
            ((bool *)local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x30)
  ;
  undo::UndoHistory::redo(&local_70);
  local_78[0] = 2;
  expect_eq<int,int>((int *)local_78,(int *)(local_78 + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x32);
  local_78[0]._0_1_ = true;
  local_79 = undo::UndoHistory::canUndo(&local_70);
  expect_eq<bool,bool>
            ((bool *)local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x33)
  ;
  local_78[0] = (uint)local_78[0]._1_3_ << 8;
  local_79 = undo::UndoHistory::canRedo(&local_70);
  expect_eq<bool,bool>
            ((bool *)local_78,&local_79,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x34)
  ;
  undo::UndoHistory::~UndoHistory(&local_70);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
  int model = 0;
  Cmd cmd1(model, 1, 0);
  Cmd cmd2(model, 2, 1);

  EXPECT_EQ(0, model);
  cmd1.redo();
  EXPECT_EQ(1, model);
  cmd2.redo();
  EXPECT_EQ(2, model);

  UndoHistory history;
  EXPECT_FALSE(history.canUndo());
  EXPECT_FALSE(history.canRedo());
  history.add(&cmd1);
  EXPECT_TRUE(history.canUndo());
  EXPECT_FALSE(history.canRedo());
  history.add(&cmd2);
  EXPECT_TRUE(history.canUndo());
  EXPECT_FALSE(history.canRedo());

  history.undo();
  EXPECT_EQ(1, model);
  EXPECT_TRUE(history.canUndo());
  EXPECT_TRUE(history.canRedo());
  history.undo();
  EXPECT_EQ(0, model);
  EXPECT_FALSE(history.canUndo());
  EXPECT_TRUE(history.canRedo());

  history.redo();
  EXPECT_EQ(1, model);
  EXPECT_TRUE(history.canUndo());
  EXPECT_TRUE(history.canRedo());
  history.redo();
  EXPECT_EQ(2, model);
  EXPECT_TRUE(history.canUndo());
  EXPECT_FALSE(history.canRedo());
}